

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

Abc_Cex_t * Cex_ManGenCex(Cec_ManSat_t *p,int iOut)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Abc_Cex_t *pAVar5;
  ulong uVar6;
  int iVar7;
  
  pAVar5 = Abc_CexAlloc(0,p->pAig->vCis->nSize,1);
  pAVar5->iPo = iOut;
  pAVar5->iFrame = 0;
  pGVar2 = p->pAig;
  pVVar3 = pGVar2->vCis;
  iVar7 = pVVar3->nSize;
  if (0 < iVar7) {
    piVar4 = pVVar3->pArray;
    uVar6 = 0;
    do {
      iVar1 = piVar4[uVar6];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar1 = p->pSatVars[iVar1];
      if (0 < (long)iVar1) {
        if (p->pSat->size <= iVar1) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (p->pSat->model[iVar1] == 1) {
          (&pAVar5[1].iPo)[uVar6 >> 5 & 0x7ffffff] =
               (&pAVar5[1].iPo)[uVar6 >> 5 & 0x7ffffff] | 1 << ((byte)uVar6 & 0x1f);
          iVar7 = pVVar3->nSize;
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)iVar7);
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Cex_ManGenCex( Cec_ManSat_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    int i;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p->pAig), 1 );
    pCex->iPo = iOut;
    pCex->iFrame = 0;
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        int iVar = Cec_ObjSatNum(p, Gia_ManCi(p->pAig, i));
        if ( iVar > 0 && sat_solver_var_value(p->pSat, iVar) )
            pCex->pData[i>>5] |= (1<<(i & 31));     
    }
    return pCex;
}